

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.cpp
# Opt level: O1

void __thiscall
Book::Book(Book *this,Genre genre,string *isbn,string *title,string *author,Date *copyright_date,
          bool is_checked_out)

{
  pointer pcVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  bool bVar2;
  long *plVar3;
  pointer psVar4;
  regex regex;
  undefined1 local_b8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  string *local_80;
  string *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  this->genre = genre;
  local_78 = &this->isbn;
  local_88 = &(this->isbn).field_2;
  (this->isbn)._M_dataplus._M_p = (pointer)local_88;
  pcVar1 = (isbn->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,pcVar1,pcVar1 + isbn->_M_string_length);
  local_80 = &this->title;
  local_90 = &(this->title).field_2;
  (this->title)._M_dataplus._M_p = (pointer)local_90;
  pcVar1 = (title->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar1,pcVar1 + title->_M_string_length);
  (this->author)._M_dataplus._M_p = (pointer)&(this->author).field_2;
  pcVar1 = (author->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->author,pcVar1,pcVar1 + author->_M_string_length);
  (this->copyright_date).days = copyright_date->days;
  this->is_chkd_out = is_checked_out;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_50,"\\d+-\\d+-\\d+-(\\w|\\d+)",0x10);
  __s._M_current = (isbn->_M_dataplus)._M_p;
  local_b8._16_8_ = (pointer)0x0;
  local_b8._24_8_ = (char *)0x0;
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = (pointer)0x0;
  bVar2 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + isbn->_M_string_length),
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_b8,&local_50,0);
  if ((pointer)local_b8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
  }
  if (!bVar2) {
    std::operator+(&local_70,"\'",isbn);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
    psVar4 = (pointer)(plVar3 + 2);
    if ((pointer)*plVar3 == psVar4) {
      local_b8._16_8_ =
           (psVar4->
           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).first._M_current;
      local_b8._24_8_ = plVar3[3];
      local_b8._0_8_ = (pointer)(local_b8 + 0x10);
    }
    else {
      local_b8._16_8_ =
           (psVar4->
           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).first._M_current;
      local_b8._0_8_ = (pointer)*plVar3;
    }
    local_b8._8_8_ = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    error((string *)local_b8);
    if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
  return;
}

Assistant:

Book::Book(
	Genre genre,
	const std::string& isbn,
	const std::string& title,
	const std::string& author,
	const Date& copyright_date,
	bool is_checked_out
) : genre{ genre },
isbn{ isbn },
title{ title },
author{ author },
copyright_date{ copyright_date },
is_chkd_out{ is_checked_out }
{
	std::regex regex{ R"(\d+-\d+-\d+-(\w|\d+))" };
	if (!std::regex_match(isbn, regex))
		error("'" + isbn + "' is not a correct ISBN.");
}